

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_reader.cpp
# Opt level: O1

double duckdb::ParquetDecimalUtils::ReadDecimalValue<double>
                 (const_data_ptr_t pointer,idx_t size,ParquetColumnSchema *schema_ele)

{
  data_t dVar1;
  ulong uVar2;
  byte *pbVar3;
  idx_t iVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  uint64_t input;
  undefined8 local_30;
  double local_28;
  undefined8 uStack_20;
  
  dVar1 = *pointer;
  if (size == 0) {
    local_28 = 0.0;
  }
  else {
    local_28 = 0.0;
    uVar5 = 0;
    iVar4 = size;
    do {
      uVar2 = 8;
      if (iVar4 < 8) {
        uVar2 = iVar4;
      }
      local_30 = 0;
      lVar6 = 0;
      pbVar3 = pointer;
      do {
        *(byte *)((long)&local_30 + lVar6 + 7) = *pbVar3 ^ (char)dVar1 >> 7;
        lVar6 = lVar6 + -1;
        pbVar3 = pbVar3 + 1;
      } while (-(ulong)(uVar2 == 0) - uVar2 != lVar6);
      local_28 = local_28 * 1.8446744073709552e+19 + 0.0;
      uVar5 = uVar5 + 8;
      iVar4 = iVar4 - 8;
      pointer = pointer + 8;
    } while (uVar5 < size);
  }
  uStack_20 = 0;
  if ((char)dVar1 < '\0') {
    local_28 = local_28 + 1.0;
    dVar7 = pow(10.0,(double)schema_ele->type_scale);
    local_28 = -local_28;
  }
  else {
    dVar7 = pow(10.0,(double)schema_ele->type_scale);
  }
  return local_28 / dVar7;
}

Assistant:

double ParquetDecimalUtils::ReadDecimalValue(const_data_ptr_t pointer, idx_t size,
                                             const ParquetColumnSchema &schema_ele) {
	double res = 0;
	bool positive = (*pointer & 0x80) == 0;
	for (idx_t i = 0; i < size; i += 8) {
		auto byte_size = MinValue<idx_t>(sizeof(uint64_t), size - i);
		uint64_t input = 0;
		auto res_ptr = reinterpret_cast<uint8_t *>(&input);
		for (idx_t k = 0; k < byte_size; k++) {
			auto byte = pointer[i + k];
			res_ptr[sizeof(uint64_t) - k - 1] = positive ? byte : byte ^ 0xFF;
		}
		res *= double(NumericLimits<uint64_t>::Maximum()) + 1;
		res += static_cast<double>(input);
	}
	if (!positive) {
		res += 1;
		res /= pow(10, schema_ele.type_scale);
		return -res;
	}
	res /= pow(10, schema_ele.type_scale);
	return res;
}